

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O1

void __thiscall Js::RuntimeFunction::SetFunctionNameId(RuntimeFunction *this,Var nameId)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((this->functionNameId).ptr != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                ,0x42,"(functionNameId == __null)","functionNameId == NULL");
    if (!bVar2) goto LAB_00d56c66;
    *puVar3 = 0;
  }
  uVar4 = (ulong)nameId & 0xffff000000000000;
  uVar5 = (ulong)nameId & 0x1ffff00000000;
  if (uVar5 != 0x1000000000000 && uVar4 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d56c66;
    *puVar3 = 0;
  }
  if (uVar4 != 0x1000000000000) {
    bVar2 = VarIs<Js::JavascriptString>(nameId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                  ,0x43,
                                  "(TaggedInt::Is(nameId) || Js::VarIs<Js::JavascriptString>(nameId))"
                                  ,
                                  "TaggedInt::Is(nameId) || Js::VarIs<Js::JavascriptString>(nameId)"
                                 );
      if (!bVar2) goto LAB_00d56c66;
      *puVar3 = 0;
    }
  }
  if (uVar5 != 0x1000000000000 && uVar4 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d56c66;
    *puVar3 = 0;
  }
  if (uVar4 == 0x1000000000000) {
    this_00 = (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.
                 ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    if (uVar5 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00d56c66;
      *puVar3 = 0;
    }
    bVar2 = ScriptContext::IsTrackedPropertyId(this_00,(PropertyId)nameId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RuntimeFunction.cpp"
                                  ,0x46,
                                  "(!TaggedInt::Is(nameId) || this->GetScriptContext()->IsTrackedPropertyId(TaggedInt::ToInt32(nameId)))"
                                  ,
                                  "!TaggedInt::Is(nameId) || this->GetScriptContext()->IsTrackedPropertyId(TaggedInt::ToInt32(nameId))"
                                 );
      if (!bVar2) {
LAB_00d56c66:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  this->isDisplayString = false;
  Memory::Recycler::WBSetBit((char *)&this->functionNameId);
  (this->functionNameId).ptr = nameId;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->functionNameId);
  return;
}

Assistant:

void
    RuntimeFunction::SetFunctionNameId(Var nameId)
    {
        Assert(functionNameId == NULL);
        Assert(TaggedInt::Is(nameId) || Js::VarIs<Js::JavascriptString>(nameId));

        // We are only reference the propertyId, it needs to be tracked to stay alive
        Assert(!TaggedInt::Is(nameId) || this->GetScriptContext()->IsTrackedPropertyId(TaggedInt::ToInt32(nameId)));
        this->isDisplayString = false;
        this->functionNameId = nameId;
    }